

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void fadst16x16_sse4_1(__m128i *in,__m128i *out,int bit,int num_cols)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  longlong lVar27;
  longlong lVar28;
  longlong lVar29;
  longlong lVar30;
  longlong lVar31;
  longlong lVar32;
  longlong lVar33;
  longlong lVar34;
  longlong lVar35;
  longlong lVar36;
  longlong lVar37;
  longlong lVar38;
  longlong lVar39;
  longlong lVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 *puVar59;
  undefined1 (*pauVar60) [16];
  undefined1 (*pauVar61) [16];
  undefined1 (*pauVar62) [16];
  undefined1 (*pauVar63) [16];
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  undefined8 extraout_XMM0_Qa_17;
  undefined8 extraout_XMM0_Qa_18;
  undefined8 extraout_XMM0_Qa_19;
  undefined8 extraout_XMM0_Qa_20;
  undefined8 extraout_XMM0_Qa_21;
  undefined8 extraout_XMM0_Qa_22;
  undefined8 extraout_XMM0_Qa_23;
  undefined8 extraout_XMM0_Qa_24;
  undefined8 extraout_XMM0_Qa_25;
  undefined8 extraout_XMM0_Qa_26;
  undefined8 extraout_XMM0_Qa_27;
  undefined8 extraout_XMM0_Qa_28;
  undefined8 extraout_XMM0_Qa_29;
  undefined8 extraout_XMM0_Qa_30;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  undefined8 extraout_XMM0_Qb_14;
  undefined8 extraout_XMM0_Qb_15;
  undefined8 extraout_XMM0_Qb_16;
  undefined8 extraout_XMM0_Qb_17;
  undefined8 extraout_XMM0_Qb_18;
  undefined8 extraout_XMM0_Qb_19;
  undefined8 extraout_XMM0_Qb_20;
  undefined8 extraout_XMM0_Qb_21;
  undefined8 extraout_XMM0_Qb_22;
  undefined8 extraout_XMM0_Qb_23;
  undefined8 extraout_XMM0_Qb_24;
  undefined8 extraout_XMM0_Qb_25;
  undefined8 extraout_XMM0_Qb_26;
  undefined8 extraout_XMM0_Qb_27;
  undefined8 extraout_XMM0_Qb_28;
  undefined8 extraout_XMM0_Qb_29;
  undefined8 extraout_XMM0_Qb_30;
  int col;
  __m128i y;
  __m128i x;
  __m128i v [16];
  __m128i u [16];
  __m128i zero;
  __m128i rnding;
  __m128i cospim58;
  __m128i cospi6;
  __m128i cospi58;
  __m128i cospim50;
  __m128i cospi14;
  __m128i cospi50;
  __m128i cospim42;
  __m128i cospi22;
  __m128i cospi42;
  __m128i cospim34;
  __m128i cospi30;
  __m128i cospi34;
  __m128i cospim26;
  __m128i cospi38;
  __m128i cospi26;
  __m128i cospim18;
  __m128i cospi46;
  __m128i cospi18;
  __m128i cospim10;
  __m128i cospi54;
  __m128i cospi10;
  __m128i cospim2;
  __m128i cospi62;
  __m128i cospi2;
  __m128i cospi40;
  __m128i cospim40;
  __m128i cospim24;
  __m128i cospi24;
  __m128i cospim8;
  __m128i cospim56;
  __m128i cospi56;
  __m128i cospi8;
  __m128i cospim48;
  __m128i cospim16;
  __m128i cospi16;
  __m128i cospi48;
  __m128i cospi32;
  int32_t *cospi;
  int local_152c;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  int local_13f8;
  int iStack_13f4;
  int iStack_13f0;
  int iStack_13ec;
  int local_13e8;
  int iStack_13e4;
  int iStack_13e0;
  int iStack_13dc;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  int local_13c8;
  int iStack_13c4;
  int iStack_13c0;
  int iStack_13bc;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  int local_1398;
  int iStack_1394;
  int iStack_1390;
  int iStack_138c;
  int local_1388;
  int iStack_1384;
  int iStack_1380;
  int iStack_137c;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  int local_1358;
  int iStack_1354;
  int iStack_1350;
  int iStack_134c;
  int local_1348;
  int iStack_1344;
  int iStack_1340;
  int iStack_133c;
  int local_1338;
  int iStack_1334;
  int iStack_1330;
  int iStack_132c;
  int local_1328;
  int iStack_1324;
  int iStack_1320;
  int iStack_131c;
  int local_1318;
  int iStack_1314;
  int iStack_1310;
  int iStack_130c;
  undefined8 local_1308;
  undefined8 uStack_1300;
  int local_12f8;
  int iStack_12f4;
  int iStack_12f0;
  int iStack_12ec;
  longlong local_12e8;
  longlong lStack_12e0;
  longlong local_12d8;
  longlong lStack_12d0;
  longlong local_12c8;
  longlong lStack_12c0;
  longlong local_12b8;
  longlong lStack_12b0;
  longlong local_12a8;
  longlong lStack_12a0;
  longlong local_1298;
  longlong lStack_1290;
  longlong local_1288;
  longlong lStack_1280;
  longlong local_1278;
  longlong lStack_1270;
  longlong local_1268;
  longlong lStack_1260;
  longlong local_1258;
  longlong lStack_1250;
  longlong local_1248;
  longlong lStack_1240;
  longlong local_1238;
  longlong lStack_1230;
  longlong local_1228;
  longlong lStack_1220;
  longlong local_1218;
  longlong lStack_1210;
  longlong local_1208;
  longlong lStack_1200;
  longlong local_11f8;
  longlong lStack_11f0;
  longlong local_11e8;
  longlong lStack_11e0;
  longlong local_11d8;
  longlong lStack_11d0;
  longlong local_11c8;
  longlong lStack_11c0;
  longlong local_11b8;
  longlong lStack_11b0;
  longlong local_11a8;
  longlong lStack_11a0;
  longlong local_1198;
  longlong lStack_1190;
  longlong local_1188;
  longlong lStack_1180;
  longlong local_1178;
  longlong lStack_1170;
  longlong local_1168;
  longlong lStack_1160;
  longlong local_1158;
  longlong lStack_1150;
  longlong local_1148;
  longlong lStack_1140;
  longlong local_1138;
  longlong lStack_1130;
  longlong local_1128;
  longlong lStack_1120;
  longlong local_1118;
  longlong lStack_1110;
  longlong local_1108;
  longlong lStack_1100;
  longlong local_10f8;
  longlong lStack_10f0;
  longlong local_10e8;
  longlong lStack_10e0;
  longlong local_10d8;
  longlong lStack_10d0;
  longlong local_10c8;
  longlong lStack_10c0;
  longlong local_10b8;
  longlong lStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  int32_t *local_1098;
  int local_1090;
  uint local_108c;
  long local_1088;
  long local_1080;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  undefined8 local_1068;
  undefined8 uStack_1060;
  int local_1058;
  int iStack_1054;
  int iStack_1050;
  int iStack_104c;
  longlong local_1048;
  longlong lStack_1040;
  int local_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  longlong local_1028;
  longlong lStack_1020;
  int local_1018;
  int iStack_1014;
  int iStack_1010;
  int iStack_100c;
  undefined8 local_1008;
  undefined8 uStack_1000;
  int local_ff8;
  int iStack_ff4;
  int iStack_ff0;
  int iStack_fec;
  longlong local_fe8;
  longlong lStack_fe0;
  int local_fd8;
  int iStack_fd4;
  int iStack_fd0;
  int iStack_fcc;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  int local_fb8;
  int iStack_fb4;
  int iStack_fb0;
  int iStack_fac;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  int local_f98;
  int iStack_f94;
  int iStack_f90;
  int iStack_f8c;
  longlong local_f88;
  longlong lStack_f80;
  int local_f78;
  int iStack_f74;
  int iStack_f70;
  int iStack_f6c;
  undefined8 local_f68;
  undefined8 uStack_f60;
  int local_f58;
  int iStack_f54;
  int iStack_f50;
  int iStack_f4c;
  undefined8 local_f48;
  undefined8 uStack_f40;
  int local_f38;
  int iStack_f34;
  int iStack_f30;
  int iStack_f2c;
  undefined8 local_f28;
  undefined8 uStack_f20;
  int local_f18;
  int iStack_f14;
  int iStack_f10;
  int iStack_f0c;
  undefined8 local_f08;
  undefined8 uStack_f00;
  int local_ef8;
  int iStack_ef4;
  int iStack_ef0;
  int iStack_eec;
  longlong local_ee8;
  longlong lStack_ee0;
  int local_ed8;
  int iStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  int local_eb8;
  int iStack_eb4;
  int iStack_eb0;
  int iStack_eac;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  int local_e98;
  int iStack_e94;
  int iStack_e90;
  int iStack_e8c;
  longlong local_e88;
  longlong lStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  int local_d78;
  int iStack_d74;
  int iStack_d70;
  int iStack_d6c;
  undefined8 local_d68;
  undefined8 uStack_d60;
  int local_d58;
  int iStack_d54;
  int iStack_d50;
  int iStack_d4c;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  int local_d18;
  int iStack_d14;
  int iStack_d10;
  int iStack_d0c;
  undefined8 local_d08;
  undefined8 uStack_d00;
  int local_cf8;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  int local_cb8;
  int iStack_cb4;
  int iStack_cb0;
  int iStack_cac;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  int local_c98;
  int iStack_c94;
  int iStack_c90;
  int iStack_c8c;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  undefined8 local_c48;
  undefined8 uStack_c40;
  int local_c38;
  int iStack_c34;
  int iStack_c30;
  int iStack_c2c;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_be8;
  undefined8 uStack_be0;
  longlong local_bc8;
  longlong lStack_bc0;
  longlong local_ba8;
  longlong lStack_ba0;
  undefined8 local_b88;
  undefined8 uStack_b80;
  longlong local_b68;
  longlong lStack_b60;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b28;
  undefined8 uStack_b20;
  longlong local_b08;
  longlong lStack_b00;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  longlong local_ac8;
  longlong lStack_ac0;
  longlong local_aa8;
  longlong lStack_aa0;
  undefined8 local_a88;
  undefined8 uStack_a80;
  longlong local_a68;
  longlong lStack_a60;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a28;
  undefined8 uStack_a20;
  longlong local_a08;
  longlong lStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  uint local_76c;
  undefined8 local_768;
  undefined8 uStack_760;
  uint local_74c;
  undefined8 local_748;
  undefined8 uStack_740;
  uint local_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  uint local_70c;
  undefined8 local_708;
  undefined8 uStack_700;
  uint local_6ec;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  uint local_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  uint local_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  uint local_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  int local_670;
  int local_66c;
  int32_t local_668;
  int32_t local_664;
  int local_660;
  int32_t local_65c;
  int32_t local_658;
  int local_654;
  int32_t local_650;
  int32_t local_64c;
  int local_648;
  int32_t local_644;
  int32_t local_640;
  int local_63c;
  int32_t local_638;
  int32_t local_634;
  int local_630;
  int32_t local_62c;
  int32_t local_628;
  int local_624;
  int32_t local_620;
  int32_t local_61c;
  int local_618;
  int32_t local_614;
  int32_t local_610;
  int32_t local_60c;
  int local_608;
  int local_604;
  int32_t local_600;
  int local_5fc;
  int local_5f8;
  int32_t local_5f4;
  int32_t local_5f0;
  int local_5ec;
  int local_5e8;
  int32_t local_5e4;
  int32_t local_5e0;
  int32_t local_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  int32_t local_4c8;
  int32_t local_4c4;
  int32_t local_4c0;
  int32_t local_4bc;
  longlong local_4b8;
  longlong lStack_4b0;
  int32_t local_4a8;
  int32_t local_4a4;
  int32_t local_4a0;
  int32_t local_49c;
  longlong local_498;
  longlong lStack_490;
  int32_t local_488;
  int32_t local_484;
  int32_t local_480;
  int32_t local_47c;
  longlong local_478;
  longlong lStack_470;
  int local_468;
  int local_464;
  int local_460;
  int local_45c;
  longlong local_458;
  longlong lStack_450;
  int local_448;
  int local_444;
  int local_440;
  int local_43c;
  longlong local_438;
  longlong lStack_430;
  int32_t local_428;
  int32_t local_424;
  int32_t local_420;
  int32_t local_41c;
  longlong local_418;
  longlong lStack_410;
  int32_t local_408;
  int32_t local_404;
  int32_t local_400;
  int32_t local_3fc;
  longlong local_3f8;
  longlong lStack_3f0;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  longlong local_3d8;
  longlong lStack_3d0;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  longlong local_3b8;
  longlong lStack_3b0;
  int32_t local_3a8;
  int32_t local_3a4;
  int32_t local_3a0;
  int32_t local_39c;
  longlong local_398;
  longlong lStack_390;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  longlong local_378;
  longlong lStack_370;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  longlong local_358;
  longlong lStack_350;
  int32_t local_348;
  int32_t local_344;
  int32_t local_340;
  int32_t local_33c;
  longlong local_338;
  longlong lStack_330;
  int32_t local_328;
  int32_t local_324;
  int32_t local_320;
  int32_t local_31c;
  longlong local_318;
  longlong lStack_310;
  int32_t local_308;
  int32_t local_304;
  int32_t local_300;
  int32_t local_2fc;
  longlong local_2f8;
  longlong lStack_2f0;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  longlong local_2d8;
  longlong lStack_2d0;
  int32_t local_2c8;
  int32_t local_2c4;
  int32_t local_2c0;
  int32_t local_2bc;
  longlong local_2b8;
  longlong lStack_2b0;
  int32_t local_2a8;
  int32_t local_2a4;
  int32_t local_2a0;
  int32_t local_29c;
  longlong local_298;
  longlong lStack_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  longlong local_278;
  longlong lStack_270;
  int32_t local_268;
  int32_t local_264;
  int32_t local_260;
  int32_t local_25c;
  longlong local_258;
  longlong lStack_250;
  int32_t local_248;
  int32_t local_244;
  int32_t local_240;
  int32_t local_23c;
  longlong local_238;
  longlong lStack_230;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  longlong local_218;
  longlong lStack_210;
  int32_t local_208;
  int32_t local_204;
  int32_t local_200;
  int32_t local_1fc;
  longlong local_1f8;
  longlong lStack_1f0;
  int32_t local_1e8;
  int32_t local_1e4;
  int32_t local_1e0;
  int32_t local_1dc;
  longlong local_1d8;
  longlong lStack_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  longlong local_1b8;
  longlong lStack_1b0;
  int32_t local_1a8;
  int32_t local_1a4;
  int32_t local_1a0;
  int32_t local_19c;
  longlong local_198;
  longlong lStack_190;
  int32_t local_188;
  int32_t local_184;
  int32_t local_180;
  int32_t local_17c;
  longlong local_178;
  longlong lStack_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  longlong local_158;
  longlong lStack_150;
  int32_t local_148;
  int32_t local_144;
  int32_t local_140;
  int32_t local_13c;
  longlong local_138;
  longlong lStack_130;
  int32_t local_128;
  int32_t local_124;
  int32_t local_120;
  int32_t local_11c;
  longlong local_118;
  longlong lStack_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  longlong local_f8;
  longlong lStack_f0;
  int32_t local_e8;
  int32_t local_e4;
  int32_t local_e0;
  int32_t local_dc;
  longlong local_d8;
  longlong lStack_d0;
  int32_t local_c8;
  int32_t local_c4;
  int32_t local_c0;
  int32_t local_bc;
  longlong local_b8;
  longlong lStack_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  longlong local_98;
  longlong lStack_90;
  int32_t local_88;
  int32_t local_84;
  int32_t local_80;
  int32_t local_7c;
  longlong local_78;
  longlong lStack_70;
  int32_t local_68;
  int32_t local_64;
  int32_t local_60;
  int32_t local_5c;
  longlong local_58;
  longlong lStack_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_1090 = in_ECX;
  local_108c = in_EDX;
  local_1088 = in_RSI;
  local_1080 = in_RDI;
  local_1098 = cospi_arr(in_EDX);
  local_5dc = local_1098[0x20];
  local_10a8 = CONCAT44(local_5dc,local_5dc);
  uStack_10a0 = CONCAT44(local_5dc,local_5dc);
  local_5e0 = local_1098[0x30];
  local_10b8 = CONCAT44(local_5e0,local_5e0);
  lStack_10b0 = CONCAT44(local_5e0,local_5e0);
  local_5e4 = local_1098[0x10];
  local_10c8 = CONCAT44(local_5e4,local_5e4);
  lStack_10c0 = CONCAT44(local_5e4,local_5e4);
  local_5e8 = -local_1098[0x10];
  local_10d8 = CONCAT44(local_5e8,local_5e8);
  lStack_10d0 = CONCAT44(local_5e8,local_5e8);
  local_5ec = -local_1098[0x30];
  local_10e8 = CONCAT44(local_5ec,local_5ec);
  lStack_10e0 = CONCAT44(local_5ec,local_5ec);
  local_5f0 = local_1098[8];
  local_10f8 = CONCAT44(local_5f0,local_5f0);
  lStack_10f0 = CONCAT44(local_5f0,local_5f0);
  local_5f4 = local_1098[0x38];
  local_1108 = CONCAT44(local_5f4,local_5f4);
  lStack_1100 = CONCAT44(local_5f4,local_5f4);
  local_5f8 = -local_1098[0x38];
  local_1118 = CONCAT44(local_5f8,local_5f8);
  lStack_1110 = CONCAT44(local_5f8,local_5f8);
  local_5fc = -local_1098[8];
  local_1128 = CONCAT44(local_5fc,local_5fc);
  lStack_1120 = CONCAT44(local_5fc,local_5fc);
  local_600 = local_1098[0x18];
  local_1138 = CONCAT44(local_600,local_600);
  lStack_1130 = CONCAT44(local_600,local_600);
  local_604 = -local_1098[0x18];
  local_1148 = CONCAT44(local_604,local_604);
  lStack_1140 = CONCAT44(local_604,local_604);
  local_608 = -local_1098[0x28];
  local_1158 = CONCAT44(local_608,local_608);
  lStack_1150 = CONCAT44(local_608,local_608);
  local_60c = local_1098[0x28];
  local_1168 = CONCAT44(local_60c,local_60c);
  lStack_1160 = CONCAT44(local_60c,local_60c);
  local_610 = local_1098[2];
  local_1178 = CONCAT44(local_610,local_610);
  lStack_1170 = CONCAT44(local_610,local_610);
  local_614 = local_1098[0x3e];
  local_1188 = CONCAT44(local_614,local_614);
  lStack_1180 = CONCAT44(local_614,local_614);
  local_618 = -local_1098[2];
  local_1198 = CONCAT44(local_618,local_618);
  lStack_1190 = CONCAT44(local_618,local_618);
  local_61c = local_1098[10];
  local_11a8 = CONCAT44(local_61c,local_61c);
  lStack_11a0 = CONCAT44(local_61c,local_61c);
  local_620 = local_1098[0x36];
  local_11b8 = CONCAT44(local_620,local_620);
  lStack_11b0 = CONCAT44(local_620,local_620);
  local_624 = -local_1098[10];
  local_11c8 = CONCAT44(local_624,local_624);
  lStack_11c0 = CONCAT44(local_624,local_624);
  local_628 = local_1098[0x12];
  local_11d8 = CONCAT44(local_628,local_628);
  lStack_11d0 = CONCAT44(local_628,local_628);
  local_62c = local_1098[0x2e];
  local_11e8 = CONCAT44(local_62c,local_62c);
  lStack_11e0 = CONCAT44(local_62c,local_62c);
  local_630 = -local_1098[0x12];
  local_11f8 = CONCAT44(local_630,local_630);
  lStack_11f0 = CONCAT44(local_630,local_630);
  local_634 = local_1098[0x1a];
  local_1208 = CONCAT44(local_634,local_634);
  lStack_1200 = CONCAT44(local_634,local_634);
  local_638 = local_1098[0x26];
  local_1218 = CONCAT44(local_638,local_638);
  lStack_1210 = CONCAT44(local_638,local_638);
  local_63c = -local_1098[0x1a];
  local_1228 = CONCAT44(local_63c,local_63c);
  lStack_1220 = CONCAT44(local_63c,local_63c);
  local_640 = local_1098[0x22];
  local_1238 = CONCAT44(local_640,local_640);
  lStack_1230 = CONCAT44(local_640,local_640);
  local_644 = local_1098[0x1e];
  local_1248 = CONCAT44(local_644,local_644);
  lStack_1240 = CONCAT44(local_644,local_644);
  local_648 = -local_1098[0x22];
  local_1258 = CONCAT44(local_648,local_648);
  lStack_1250 = CONCAT44(local_648,local_648);
  local_64c = local_1098[0x2a];
  local_1268 = CONCAT44(local_64c,local_64c);
  lStack_1260 = CONCAT44(local_64c,local_64c);
  local_650 = local_1098[0x16];
  local_1278 = CONCAT44(local_650,local_650);
  lStack_1270 = CONCAT44(local_650,local_650);
  local_654 = -local_1098[0x2a];
  local_1288 = CONCAT44(local_654,local_654);
  lStack_1280 = CONCAT44(local_654,local_654);
  local_658 = local_1098[0x32];
  local_1298 = CONCAT44(local_658,local_658);
  lStack_1290 = CONCAT44(local_658,local_658);
  local_65c = local_1098[0xe];
  local_12a8 = CONCAT44(local_65c,local_65c);
  lStack_12a0 = CONCAT44(local_65c,local_65c);
  local_660 = -local_1098[0x32];
  local_12b8 = CONCAT44(local_660,local_660);
  lStack_12b0 = CONCAT44(local_660,local_660);
  local_664 = local_1098[0x3a];
  local_12c8 = CONCAT44(local_664,local_664);
  lStack_12c0 = CONCAT44(local_664,local_664);
  local_668 = local_1098[6];
  local_12d8 = CONCAT44(local_668,local_668);
  lStack_12d0 = CONCAT44(local_668,local_668);
  local_66c = -local_1098[0x3a];
  local_12e8 = CONCAT44(local_66c,local_66c);
  lStack_12e0 = CONCAT44(local_66c,local_66c);
  local_670 = 1 << ((char)local_108c - 1U & 0x1f);
  local_18 = 0;
  uStack_10 = 0;
  local_1308 = 0;
  uStack_1300 = 0;
  local_4d8 = local_10a8;
  uStack_4d0 = uStack_10a0;
  local_4c8 = local_5dc;
  local_4c4 = local_5dc;
  local_4c0 = local_5dc;
  local_4bc = local_5dc;
  local_4b8 = local_10b8;
  lStack_4b0 = lStack_10b0;
  local_4a8 = local_5e0;
  local_4a4 = local_5e0;
  local_4a0 = local_5e0;
  local_49c = local_5e0;
  local_498 = local_10c8;
  lStack_490 = lStack_10c0;
  local_488 = local_5e4;
  local_484 = local_5e4;
  local_480 = local_5e4;
  local_47c = local_5e4;
  local_478 = local_10d8;
  lStack_470 = lStack_10d0;
  local_468 = local_5e8;
  local_464 = local_5e8;
  local_460 = local_5e8;
  local_45c = local_5e8;
  local_458 = local_10e8;
  lStack_450 = lStack_10e0;
  local_448 = local_5ec;
  local_444 = local_5ec;
  local_440 = local_5ec;
  local_43c = local_5ec;
  local_438 = local_10f8;
  lStack_430 = lStack_10f0;
  local_428 = local_5f0;
  local_424 = local_5f0;
  local_420 = local_5f0;
  local_41c = local_5f0;
  local_418 = local_1108;
  lStack_410 = lStack_1100;
  local_408 = local_5f4;
  local_404 = local_5f4;
  local_400 = local_5f4;
  local_3fc = local_5f4;
  local_3f8 = local_1118;
  lStack_3f0 = lStack_1110;
  local_3e8 = local_5f8;
  local_3e4 = local_5f8;
  local_3e0 = local_5f8;
  local_3dc = local_5f8;
  local_3d8 = local_1128;
  lStack_3d0 = lStack_1120;
  local_3c8 = local_5fc;
  local_3c4 = local_5fc;
  local_3c0 = local_5fc;
  local_3bc = local_5fc;
  local_3b8 = local_1138;
  lStack_3b0 = lStack_1130;
  local_3a8 = local_600;
  local_3a4 = local_600;
  local_3a0 = local_600;
  local_39c = local_600;
  local_398 = local_1148;
  lStack_390 = lStack_1140;
  local_388 = local_604;
  local_384 = local_604;
  local_380 = local_604;
  local_37c = local_604;
  local_378 = local_1158;
  lStack_370 = lStack_1150;
  local_368 = local_608;
  local_364 = local_608;
  local_360 = local_608;
  local_35c = local_608;
  local_358 = local_1168;
  lStack_350 = lStack_1160;
  local_348 = local_60c;
  local_344 = local_60c;
  local_340 = local_60c;
  local_33c = local_60c;
  local_338 = local_1178;
  lStack_330 = lStack_1170;
  local_328 = local_610;
  local_324 = local_610;
  local_320 = local_610;
  local_31c = local_610;
  local_318 = local_1188;
  lStack_310 = lStack_1180;
  local_308 = local_614;
  local_304 = local_614;
  local_300 = local_614;
  local_2fc = local_614;
  local_2f8 = local_1198;
  lStack_2f0 = lStack_1190;
  local_2e8 = local_618;
  local_2e4 = local_618;
  local_2e0 = local_618;
  local_2dc = local_618;
  local_2d8 = local_11a8;
  lStack_2d0 = lStack_11a0;
  local_2c8 = local_61c;
  local_2c4 = local_61c;
  local_2c0 = local_61c;
  local_2bc = local_61c;
  local_2b8 = local_11b8;
  lStack_2b0 = lStack_11b0;
  local_2a8 = local_620;
  local_2a4 = local_620;
  local_2a0 = local_620;
  local_29c = local_620;
  local_298 = local_11c8;
  lStack_290 = lStack_11c0;
  local_288 = local_624;
  local_284 = local_624;
  local_280 = local_624;
  local_27c = local_624;
  local_278 = local_11d8;
  lStack_270 = lStack_11d0;
  local_268 = local_628;
  local_264 = local_628;
  local_260 = local_628;
  local_25c = local_628;
  local_258 = local_11e8;
  lStack_250 = lStack_11e0;
  local_248 = local_62c;
  local_244 = local_62c;
  local_240 = local_62c;
  local_23c = local_62c;
  local_238 = local_11f8;
  lStack_230 = lStack_11f0;
  local_228 = local_630;
  local_224 = local_630;
  local_220 = local_630;
  local_21c = local_630;
  local_218 = local_1208;
  lStack_210 = lStack_1200;
  local_208 = local_634;
  local_204 = local_634;
  local_200 = local_634;
  local_1fc = local_634;
  local_1f8 = local_1218;
  lStack_1f0 = lStack_1210;
  local_1e8 = local_638;
  local_1e4 = local_638;
  local_1e0 = local_638;
  local_1dc = local_638;
  local_1d8 = local_1228;
  lStack_1d0 = lStack_1220;
  local_1c8 = local_63c;
  local_1c4 = local_63c;
  local_1c0 = local_63c;
  local_1bc = local_63c;
  local_1b8 = local_1238;
  lStack_1b0 = lStack_1230;
  local_1a8 = local_640;
  local_1a4 = local_640;
  local_1a0 = local_640;
  local_19c = local_640;
  local_198 = local_1248;
  lStack_190 = lStack_1240;
  local_188 = local_644;
  local_184 = local_644;
  local_180 = local_644;
  local_17c = local_644;
  local_178 = local_1258;
  lStack_170 = lStack_1250;
  local_168 = local_648;
  local_164 = local_648;
  local_160 = local_648;
  local_15c = local_648;
  local_158 = local_1268;
  lStack_150 = lStack_1260;
  local_148 = local_64c;
  local_144 = local_64c;
  local_140 = local_64c;
  local_13c = local_64c;
  local_138 = local_1278;
  lStack_130 = lStack_1270;
  local_128 = local_650;
  local_124 = local_650;
  local_120 = local_650;
  local_11c = local_650;
  local_118 = local_1288;
  lStack_110 = lStack_1280;
  local_108 = local_654;
  local_104 = local_654;
  local_100 = local_654;
  local_fc = local_654;
  local_f8 = local_1298;
  lStack_f0 = lStack_1290;
  local_e8 = local_658;
  local_e4 = local_658;
  local_e0 = local_658;
  local_dc = local_658;
  local_d8 = local_12a8;
  lStack_d0 = lStack_12a0;
  local_c8 = local_65c;
  local_c4 = local_65c;
  local_c0 = local_65c;
  local_bc = local_65c;
  local_b8 = local_12b8;
  lStack_b0 = lStack_12b0;
  local_a8 = local_660;
  local_a4 = local_660;
  local_a0 = local_660;
  local_9c = local_660;
  local_98 = local_12c8;
  lStack_90 = lStack_12c0;
  local_88 = local_664;
  local_84 = local_664;
  local_80 = local_664;
  local_7c = local_664;
  local_78 = local_12d8;
  lStack_70 = lStack_12d0;
  local_68 = local_668;
  local_64 = local_668;
  local_60 = local_668;
  local_5c = local_668;
  local_58 = local_12e8;
  lStack_50 = lStack_12e0;
  local_48 = local_66c;
  local_44 = local_66c;
  local_40 = local_66c;
  local_3c = local_66c;
  local_28 = local_670;
  local_24 = local_670;
  local_20 = local_670;
  local_1c = local_670;
  local_12f8 = local_670;
  iStack_12f4 = local_670;
  local_38 = local_670;
  iStack_34 = local_670;
  iStack_12f0 = local_670;
  iStack_12ec = local_670;
  iStack_30 = local_670;
  iStack_2c = local_670;
  for (local_152c = 0; local_152c < local_1090; local_152c = local_152c + 1) {
    puVar59 = (undefined8 *)(local_1080 + (long)local_152c * 0x10);
    local_908 = *puVar59;
    uStack_900 = puVar59[1];
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 0xf + local_152c) * 0x10);
    uVar1 = *puVar59;
    uVar2 = puVar59[1];
    local_788 = local_1308;
    uVar57 = local_788;
    uStack_780 = uStack_1300;
    uVar58 = uStack_780;
    local_788._0_4_ = (int)local_1308;
    local_788._4_4_ = (int)((ulong)local_1308 >> 0x20);
    uStack_780._0_4_ = (int)uStack_1300;
    uStack_780._4_4_ = (int)((ulong)uStack_1300 >> 0x20);
    local_798._0_4_ = (int)uVar1;
    local_798._4_4_ = (int)((ulong)uVar1 >> 0x20);
    uStack_790._0_4_ = (int)uVar2;
    uStack_790._4_4_ = (int)((ulong)uVar2 >> 0x20);
    local_798._0_4_ = (int)local_788 - (int)local_798;
    local_798._4_4_ = local_788._4_4_ - local_798._4_4_;
    uStack_790._0_4_ = (int)uStack_780 - (int)uStack_790;
    uStack_790._4_4_ = uStack_780._4_4_ - uStack_790._4_4_;
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 7 + local_152c) * 0x10);
    uVar3 = *puVar59;
    uVar4 = puVar59[1];
    local_7a8 = local_1308;
    uStack_7a0 = uStack_1300;
    local_7b8._0_4_ = (int)uVar3;
    local_7b8._4_4_ = (int)((ulong)uVar3 >> 0x20);
    uStack_7b0._0_4_ = (int)uVar4;
    uStack_7b0._4_4_ = (int)((ulong)uVar4 >> 0x20);
    pauVar60 = (undefined1 (*) [16])(local_1080 + (long)(local_1090 * 8 + local_152c) * 0x10);
    local_508 = *(undefined8 *)*pauVar60;
    uStack_500 = *(undefined8 *)(*pauVar60 + 8);
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 3 + local_152c) * 0x10);
    uVar5 = *puVar59;
    uVar6 = puVar59[1];
    local_7c8 = local_1308;
    uStack_7c0 = uStack_1300;
    local_7d8._0_4_ = (int)uVar5;
    local_7d8._4_4_ = (int)((ulong)uVar5 >> 0x20);
    uStack_7d0._0_4_ = (int)uVar6;
    uStack_7d0._4_4_ = (int)((ulong)uVar6 >> 0x20);
    local_7d8._0_4_ = (int)local_788 - (int)local_7d8;
    local_7d8._4_4_ = local_788._4_4_ - local_7d8._4_4_;
    uStack_7d0._0_4_ = (int)uStack_780 - (int)uStack_7d0;
    uStack_7d0._4_4_ = uStack_780._4_4_ - uStack_7d0._4_4_;
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 0xc + local_152c) * 0x10);
    local_968 = *puVar59;
    uStack_960 = puVar59[1];
    pauVar61 = (undefined1 (*) [16])(local_1080 + (long)(local_1090 * 4 + local_152c) * 0x10);
    local_528 = *(undefined8 *)*pauVar61;
    uStack_520 = *(undefined8 *)(*pauVar61 + 8);
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 0xb + local_152c) * 0x10);
    uVar7 = *puVar59;
    uVar8 = puVar59[1];
    local_7e8 = local_1308;
    uStack_7e0 = uStack_1300;
    local_7f8._0_4_ = (int)uVar7;
    local_7f8._4_4_ = (int)((ulong)uVar7 >> 0x20);
    uStack_7f0._0_4_ = (int)uVar8;
    uStack_7f0._4_4_ = (int)((ulong)uVar8 >> 0x20);
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 + local_152c) * 0x10);
    uVar9 = *puVar59;
    uVar10 = puVar59[1];
    local_808 = local_1308;
    uStack_800 = uStack_1300;
    local_818._0_4_ = (int)uVar9;
    local_818._4_4_ = (int)((ulong)uVar9 >> 0x20);
    uStack_810._0_4_ = (int)uVar10;
    uStack_810._4_4_ = (int)((ulong)uVar10 >> 0x20);
    local_818._0_4_ = (int)local_788 - (int)local_818;
    local_818._4_4_ = local_788._4_4_ - local_818._4_4_;
    uStack_810._0_4_ = (int)uStack_780 - (int)uStack_810;
    uStack_810._4_4_ = uStack_780._4_4_ - uStack_810._4_4_;
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 0xe + local_152c) * 0x10);
    local_9a8 = *puVar59;
    uStack_9a0 = puVar59[1];
    pauVar62 = (undefined1 (*) [16])(local_1080 + (long)(local_1090 * 6 + local_152c) * 0x10);
    local_568 = *(undefined8 *)*pauVar62;
    uStack_560 = *(undefined8 *)(*pauVar62 + 8);
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 9 + local_152c) * 0x10);
    uVar11 = *puVar59;
    uVar12 = puVar59[1];
    local_828 = local_1308;
    uStack_820 = uStack_1300;
    local_838._0_4_ = (int)uVar11;
    local_838._4_4_ = (int)((ulong)uVar11 >> 0x20);
    uStack_830._0_4_ = (int)uVar12;
    uStack_830._4_4_ = (int)((ulong)uVar12 >> 0x20);
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 2 + local_152c) * 0x10);
    local_9c8 = *puVar59;
    uStack_9c0 = puVar59[1];
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 0xd + local_152c) * 0x10);
    uVar13 = *puVar59;
    uVar14 = puVar59[1];
    local_848 = local_1308;
    uStack_840 = uStack_1300;
    local_858._0_4_ = (int)uVar13;
    local_858._4_4_ = (int)((ulong)uVar13 >> 0x20);
    uStack_850._0_4_ = (int)uVar14;
    uStack_850._4_4_ = (int)((ulong)uVar14 >> 0x20);
    local_858._0_4_ = (int)local_788 - (int)local_858;
    local_858._4_4_ = local_788._4_4_ - local_858._4_4_;
    uStack_850._0_4_ = (int)uStack_780 - (int)uStack_850;
    uStack_850._4_4_ = uStack_780._4_4_ - uStack_850._4_4_;
    puVar59 = (undefined8 *)(local_1080 + (long)(local_1090 * 5 + local_152c) * 0x10);
    uVar15 = *puVar59;
    uVar16 = puVar59[1];
    local_868 = local_1308;
    uStack_860 = uStack_1300;
    local_878._0_4_ = (int)uVar15;
    local_878._4_4_ = (int)((ulong)uVar15 >> 0x20);
    uStack_870._0_4_ = (int)uVar16;
    uStack_870._4_4_ = (int)((ulong)uVar16 >> 0x20);
    pauVar63 = (undefined1 (*) [16])(local_1080 + (long)(local_1090 * 10 + local_152c) * 0x10);
    local_5c8 = *(undefined8 *)*pauVar63;
    uStack_5c0 = *(undefined8 *)(*pauVar63 + 8);
    local_da8 = CONCAT44(local_798._4_4_,(int)local_798);
    uStack_da0 = CONCAT44(uStack_790._4_4_,(int)uStack_790);
    local_4e8 = CONCAT44(local_788._4_4_ - local_7b8._4_4_,(int)local_788 - (int)local_7b8);
    uStack_4e0 = CONCAT44(uStack_780._4_4_ - uStack_7b0._4_4_,(int)uStack_780 - (int)uStack_7b0);
    local_4f8 = local_10a8;
    uStack_4f0 = uStack_10a0;
    auVar26._8_8_ = uStack_4e0;
    auVar26._0_8_ = local_4e8;
    auVar25._8_8_ = uStack_10a0;
    auVar25._0_8_ = local_10a8;
    auVar73 = pmulld(auVar26,auVar25);
    local_518 = local_10a8;
    uStack_510 = uStack_10a0;
    auVar24._8_8_ = uStack_10a0;
    auVar24._0_8_ = local_10a8;
    auVar74 = pmulld(*pauVar60,auVar24);
    local_1518 = auVar73._0_8_;
    uStack_1510 = auVar73._8_8_;
    local_1528 = auVar74._0_8_;
    uStack_1520 = auVar74._8_8_;
    local_c08 = local_1518;
    uVar55 = local_c08;
    uStack_c00 = uStack_1510;
    uVar56 = uStack_c00;
    local_c18 = local_1528;
    uVar53 = local_c18;
    uStack_c10 = uStack_1520;
    uVar54 = uStack_c10;
    local_c08._0_4_ = auVar73._0_4_;
    local_c08._4_4_ = auVar73._4_4_;
    uStack_c00._0_4_ = auVar73._8_4_;
    uStack_c00._4_4_ = auVar73._12_4_;
    local_c18._0_4_ = auVar74._0_4_;
    local_c18._4_4_ = auVar74._4_4_;
    uStack_c10._0_4_ = auVar74._8_4_;
    uStack_c10._4_4_ = auVar74._12_4_;
    local_14e8 = CONCAT44(local_c08._4_4_ + local_c18._4_4_,(int)local_c08 + (int)local_c18);
    uStack_14e0 = CONCAT44(uStack_c00._4_4_ + uStack_c10._4_4_,(int)uStack_c00 + (int)uStack_c10);
    local_c28 = local_14e8;
    uStack_c20 = uStack_14e0;
    local_c38 = local_12f8;
    iStack_c34 = iStack_12f4;
    iStack_c30 = iStack_12f0;
    iStack_c2c = iStack_12ec;
    iVar64 = (int)local_c08 + (int)local_c18 + local_12f8;
    iVar75 = local_c08._4_4_ + local_c18._4_4_ + iStack_12f4;
    iVar88 = (int)uStack_c00 + (int)uStack_c10 + iStack_12f0;
    iVar101 = uStack_c00._4_4_ + uStack_c10._4_4_ + iStack_12ec;
    local_14e8 = CONCAT44(iVar75,iVar64);
    uStack_14e0 = CONCAT44(iVar101,iVar88);
    local_688 = local_14e8;
    uStack_680 = uStack_14e0;
    local_68c = local_108c;
    auVar73 = ZEXT416(local_108c);
    iVar64 = iVar64 >> auVar73;
    iVar75 = iVar75 >> auVar73;
    iVar88 = iVar88 >> auVar73;
    iVar101 = iVar101 >> auVar73;
    local_14e8 = CONCAT44(iVar75,iVar64);
    uStack_14e0 = CONCAT44(iVar101,iVar88);
    local_888 = local_1518;
    uStack_880 = uStack_1510;
    local_898 = local_1528;
    uStack_890 = uStack_1520;
    local_14d8 = CONCAT44(local_c08._4_4_ - local_c18._4_4_,(int)local_c08 - (int)local_c18);
    uStack_14d0 = CONCAT44(uStack_c00._4_4_ - uStack_c10._4_4_,(int)uStack_c00 - (int)uStack_c10);
    local_c48 = local_14d8;
    uStack_c40 = uStack_14d0;
    local_c58 = local_12f8;
    iStack_c54 = iStack_12f4;
    iStack_c50 = iStack_12f0;
    iStack_c4c = iStack_12ec;
    iVar65 = ((int)local_c08 - (int)local_c18) + local_12f8;
    iVar76 = (local_c08._4_4_ - local_c18._4_4_) + iStack_12f4;
    iVar89 = ((int)uStack_c00 - (int)uStack_c10) + iStack_12f0;
    iVar102 = (uStack_c00._4_4_ - uStack_c10._4_4_) + iStack_12ec;
    local_14d8 = CONCAT44(iVar76,iVar65);
    uStack_14d0 = CONCAT44(iVar102,iVar89);
    local_6a8 = local_14d8;
    uStack_6a0 = uStack_14d0;
    local_6ac = local_108c;
    auVar73 = ZEXT416(local_108c);
    iVar65 = iVar65 >> auVar73;
    iVar76 = iVar76 >> auVar73;
    iVar89 = iVar89 >> auVar73;
    iVar102 = iVar102 >> auVar73;
    local_14d8 = CONCAT44(iVar76,iVar65);
    uStack_14d0 = CONCAT44(iVar102,iVar89);
    local_dc8 = CONCAT44(local_7d8._4_4_,(int)local_7d8);
    uStack_dc0 = CONCAT44(uStack_7d0._4_4_,(int)uStack_7d0);
    local_538 = local_10a8;
    uStack_530 = uStack_10a0;
    auVar23._8_8_ = uStack_10a0;
    auVar23._0_8_ = local_10a8;
    auVar73 = pmulld(*pauVar61,auVar23);
    local_548 = CONCAT44(local_788._4_4_ - local_7f8._4_4_,(int)local_788 - (int)local_7f8);
    uStack_540 = CONCAT44(uStack_780._4_4_ - uStack_7f0._4_4_,(int)uStack_780 - (int)uStack_7f0);
    local_558 = local_10a8;
    uStack_550 = uStack_10a0;
    auVar22._8_8_ = uStack_540;
    auVar22._0_8_ = local_548;
    auVar21._8_8_ = uStack_10a0;
    auVar21._0_8_ = local_10a8;
    auVar74 = pmulld(auVar22,auVar21);
    local_1518 = auVar73._0_8_;
    uStack_1510 = auVar73._8_8_;
    local_1528 = auVar74._0_8_;
    uStack_1520 = auVar74._8_8_;
    local_c68 = local_1518;
    uVar51 = local_c68;
    uStack_c60 = uStack_1510;
    uVar52 = uStack_c60;
    local_c78 = local_1528;
    uVar49 = local_c78;
    uStack_c70 = uStack_1520;
    uVar50 = uStack_c70;
    local_c68._0_4_ = auVar73._0_4_;
    local_c68._4_4_ = auVar73._4_4_;
    uStack_c60._0_4_ = auVar73._8_4_;
    uStack_c60._4_4_ = auVar73._12_4_;
    local_c78._0_4_ = auVar74._0_4_;
    local_c78._4_4_ = auVar74._4_4_;
    uStack_c70._0_4_ = auVar74._8_4_;
    uStack_c70._4_4_ = auVar74._12_4_;
    local_14a8 = CONCAT44(local_c68._4_4_ + local_c78._4_4_,(int)local_c68 + (int)local_c78);
    uStack_14a0 = CONCAT44(uStack_c60._4_4_ + uStack_c70._4_4_,(int)uStack_c60 + (int)uStack_c70);
    local_c88 = local_14a8;
    uStack_c80 = uStack_14a0;
    local_c98 = local_12f8;
    iStack_c94 = iStack_12f4;
    iStack_c90 = iStack_12f0;
    iStack_c8c = iStack_12ec;
    iVar66 = (int)local_c68 + (int)local_c78 + local_12f8;
    iVar77 = local_c68._4_4_ + local_c78._4_4_ + iStack_12f4;
    iVar90 = (int)uStack_c60 + (int)uStack_c70 + iStack_12f0;
    iVar103 = uStack_c60._4_4_ + uStack_c70._4_4_ + iStack_12ec;
    local_14a8 = CONCAT44(iVar77,iVar66);
    uStack_14a0 = CONCAT44(iVar103,iVar90);
    local_6c8 = local_14a8;
    uStack_6c0 = uStack_14a0;
    local_6cc = local_108c;
    auVar73 = ZEXT416(local_108c);
    iVar66 = iVar66 >> auVar73;
    iVar77 = iVar77 >> auVar73;
    iVar90 = iVar90 >> auVar73;
    iVar103 = iVar103 >> auVar73;
    local_14a8 = CONCAT44(iVar77,iVar66);
    uStack_14a0 = CONCAT44(iVar103,iVar90);
    local_8a8 = local_1518;
    uStack_8a0 = uStack_1510;
    local_8b8 = local_1528;
    uStack_8b0 = uStack_1520;
    local_1498 = CONCAT44(local_c68._4_4_ - local_c78._4_4_,(int)local_c68 - (int)local_c78);
    uStack_1490 = CONCAT44(uStack_c60._4_4_ - uStack_c70._4_4_,(int)uStack_c60 - (int)uStack_c70);
    local_ca8 = local_1498;
    uStack_ca0 = uStack_1490;
    local_cb8 = local_12f8;
    iStack_cb4 = iStack_12f4;
    iStack_cb0 = iStack_12f0;
    iStack_cac = iStack_12ec;
    local_1398 = ((int)local_c68 - (int)local_c78) + local_12f8;
    iStack_1394 = (local_c68._4_4_ - local_c78._4_4_) + iStack_12f4;
    iStack_1390 = ((int)uStack_c60 - (int)uStack_c70) + iStack_12f0;
    iStack_138c = (uStack_c60._4_4_ - uStack_c70._4_4_) + iStack_12ec;
    local_1498 = CONCAT44(iStack_1394,local_1398);
    uStack_1490 = CONCAT44(iStack_138c,iStack_1390);
    local_6e8 = local_1498;
    uStack_6e0 = uStack_1490;
    local_6ec = local_108c;
    auVar73 = ZEXT416(local_108c);
    local_1398 = local_1398 >> auVar73;
    iStack_1394 = iStack_1394 >> auVar73;
    iStack_1390 = iStack_1390 >> auVar73;
    iStack_138c = iStack_138c >> auVar73;
    local_1498 = CONCAT44(iStack_1394,local_1398);
    uStack_1490 = CONCAT44(iStack_138c,iStack_1390);
    local_e08 = CONCAT44(local_818._4_4_,(int)local_818);
    uStack_e00 = CONCAT44(uStack_810._4_4_,(int)uStack_810);
    local_578 = local_10a8;
    uStack_570 = uStack_10a0;
    auVar20._8_8_ = uStack_10a0;
    auVar20._0_8_ = local_10a8;
    auVar73 = pmulld(*pauVar62,auVar20);
    local_588 = CONCAT44(local_788._4_4_ - local_838._4_4_,(int)local_788 - (int)local_838);
    uStack_580 = CONCAT44(uStack_780._4_4_ - uStack_830._4_4_,(int)uStack_780 - (int)uStack_830);
    local_598 = local_10a8;
    uStack_590 = uStack_10a0;
    auVar19._8_8_ = uStack_580;
    auVar19._0_8_ = local_588;
    auVar18._8_8_ = uStack_10a0;
    auVar18._0_8_ = local_10a8;
    auVar74 = pmulld(auVar19,auVar18);
    local_1518 = auVar73._0_8_;
    uStack_1510 = auVar73._8_8_;
    local_1528 = auVar74._0_8_;
    uStack_1520 = auVar74._8_8_;
    local_cc8 = local_1518;
    uVar47 = local_cc8;
    uStack_cc0 = uStack_1510;
    uVar48 = uStack_cc0;
    local_cd8 = local_1528;
    uVar45 = local_cd8;
    uStack_cd0 = uStack_1520;
    uVar46 = uStack_cd0;
    local_cc8._0_4_ = auVar73._0_4_;
    local_cc8._4_4_ = auVar73._4_4_;
    uStack_cc0._0_4_ = auVar73._8_4_;
    uStack_cc0._4_4_ = auVar73._12_4_;
    local_cd8._0_4_ = auVar74._0_4_;
    local_cd8._4_4_ = auVar74._4_4_;
    uStack_cd0._0_4_ = auVar74._8_4_;
    uStack_cd0._4_4_ = auVar74._12_4_;
    local_1468 = CONCAT44(local_cc8._4_4_ + local_cd8._4_4_,(int)local_cc8 + (int)local_cd8);
    uStack_1460 = CONCAT44(uStack_cc0._4_4_ + uStack_cd0._4_4_,(int)uStack_cc0 + (int)uStack_cd0);
    local_ce8 = local_1468;
    uStack_ce0 = uStack_1460;
    local_cf8 = local_12f8;
    iStack_cf4 = iStack_12f4;
    iStack_cf0 = iStack_12f0;
    iStack_cec = iStack_12ec;
    iVar67 = (int)local_cc8 + (int)local_cd8 + local_12f8;
    iVar78 = local_cc8._4_4_ + local_cd8._4_4_ + iStack_12f4;
    iVar91 = (int)uStack_cc0 + (int)uStack_cd0 + iStack_12f0;
    iVar104 = uStack_cc0._4_4_ + uStack_cd0._4_4_ + iStack_12ec;
    local_1468 = CONCAT44(iVar78,iVar67);
    uStack_1460 = CONCAT44(iVar104,iVar91);
    local_708 = local_1468;
    uStack_700 = uStack_1460;
    local_70c = local_108c;
    auVar73 = ZEXT416(local_108c);
    iVar67 = iVar67 >> auVar73;
    iVar78 = iVar78 >> auVar73;
    iVar91 = iVar91 >> auVar73;
    iVar104 = iVar104 >> auVar73;
    local_1468 = CONCAT44(iVar78,iVar67);
    uStack_1460 = CONCAT44(iVar104,iVar91);
    local_8c8 = local_1518;
    uStack_8c0 = uStack_1510;
    local_8d8 = local_1528;
    uStack_8d0 = uStack_1520;
    local_1458 = CONCAT44(local_cc8._4_4_ - local_cd8._4_4_,(int)local_cc8 - (int)local_cd8);
    uStack_1450 = CONCAT44(uStack_cc0._4_4_ - uStack_cd0._4_4_,(int)uStack_cc0 - (int)uStack_cd0);
    local_d08 = local_1458;
    uStack_d00 = uStack_1450;
    local_d18 = local_12f8;
    iStack_d14 = iStack_12f4;
    iStack_d10 = iStack_12f0;
    iStack_d0c = iStack_12ec;
    local_1358 = ((int)local_cc8 - (int)local_cd8) + local_12f8;
    iStack_1354 = (local_cc8._4_4_ - local_cd8._4_4_) + iStack_12f4;
    iStack_1350 = ((int)uStack_cc0 - (int)uStack_cd0) + iStack_12f0;
    iStack_134c = (uStack_cc0._4_4_ - uStack_cd0._4_4_) + iStack_12ec;
    local_1458 = CONCAT44(iStack_1354,local_1358);
    uStack_1450 = CONCAT44(iStack_134c,iStack_1350);
    local_728 = local_1458;
    uStack_720 = uStack_1450;
    local_72c = local_108c;
    auVar73 = ZEXT416(local_108c);
    local_1358 = local_1358 >> auVar73;
    iStack_1354 = iStack_1354 >> auVar73;
    iStack_1350 = iStack_1350 >> auVar73;
    iStack_134c = iStack_134c >> auVar73;
    local_1458 = CONCAT44(iStack_1354,local_1358);
    uStack_1450 = CONCAT44(iStack_134c,iStack_1350);
    local_e68 = CONCAT44(local_858._4_4_,(int)local_858);
    uStack_e60 = CONCAT44(uStack_850._4_4_,(int)uStack_850);
    local_5a8 = CONCAT44(local_788._4_4_ - local_878._4_4_,(int)local_788 - (int)local_878);
    uStack_5a0 = CONCAT44(uStack_780._4_4_ - uStack_870._4_4_,(int)uStack_780 - (int)uStack_870);
    local_5b8 = local_10a8;
    uStack_5b0 = uStack_10a0;
    auVar17._8_8_ = uStack_5a0;
    auVar17._0_8_ = local_5a8;
    auVar74._8_8_ = uStack_10a0;
    auVar74._0_8_ = local_10a8;
    auVar74 = pmulld(auVar17,auVar74);
    local_5d8 = local_10a8;
    uStack_5d0 = uStack_10a0;
    auVar73._8_8_ = uStack_10a0;
    auVar73._0_8_ = local_10a8;
    auVar73 = pmulld(*pauVar63,auVar73);
    local_1518 = auVar74._0_8_;
    uStack_1510 = auVar74._8_8_;
    local_1528 = auVar73._0_8_;
    uStack_1520 = auVar73._8_8_;
    local_d28 = local_1518;
    uVar43 = local_d28;
    uStack_d20 = uStack_1510;
    uVar44 = uStack_d20;
    local_d38 = local_1528;
    uVar41 = local_d38;
    uStack_d30 = uStack_1520;
    uVar42 = uStack_d30;
    local_d28._0_4_ = auVar74._0_4_;
    local_d28._4_4_ = auVar74._4_4_;
    uStack_d20._0_4_ = auVar74._8_4_;
    uStack_d20._4_4_ = auVar74._12_4_;
    local_d38._0_4_ = auVar73._0_4_;
    local_d38._4_4_ = auVar73._4_4_;
    uStack_d30._0_4_ = auVar73._8_4_;
    uStack_d30._4_4_ = auVar73._12_4_;
    local_1428 = CONCAT44(local_d28._4_4_ + local_d38._4_4_,(int)local_d28 + (int)local_d38);
    uStack_1420 = CONCAT44(uStack_d20._4_4_ + uStack_d30._4_4_,(int)uStack_d20 + (int)uStack_d30);
    local_d48 = local_1428;
    uStack_d40 = uStack_1420;
    local_d58 = local_12f8;
    iStack_d54 = iStack_12f4;
    iStack_d50 = iStack_12f0;
    iStack_d4c = iStack_12ec;
    local_1328 = (int)local_d28 + (int)local_d38 + local_12f8;
    iStack_1324 = local_d28._4_4_ + local_d38._4_4_ + iStack_12f4;
    iStack_1320 = (int)uStack_d20 + (int)uStack_d30 + iStack_12f0;
    iStack_131c = uStack_d20._4_4_ + uStack_d30._4_4_ + iStack_12ec;
    local_1428 = CONCAT44(iStack_1324,local_1328);
    uStack_1420 = CONCAT44(iStack_131c,iStack_1320);
    local_748 = local_1428;
    uStack_740 = uStack_1420;
    local_74c = local_108c;
    auVar73 = ZEXT416(local_108c);
    local_1328 = local_1328 >> auVar73;
    iStack_1324 = iStack_1324 >> auVar73;
    iStack_1320 = iStack_1320 >> auVar73;
    iStack_131c = iStack_131c >> auVar73;
    local_1428 = CONCAT44(iStack_1324,local_1328);
    uStack_1420 = CONCAT44(iStack_131c,iStack_1320);
    local_8e8 = local_1518;
    uStack_8e0 = uStack_1510;
    local_8f8 = local_1528;
    uStack_8f0 = uStack_1520;
    local_1418 = CONCAT44(local_d28._4_4_ - local_d38._4_4_,(int)local_d28 - (int)local_d38);
    uStack_1410 = CONCAT44(uStack_d20._4_4_ - uStack_d30._4_4_,(int)uStack_d20 - (int)uStack_d30);
    local_d68 = local_1418;
    uStack_d60 = uStack_1410;
    local_d78 = local_12f8;
    iStack_d74 = iStack_12f4;
    iStack_d70 = iStack_12f0;
    iStack_d6c = iStack_12ec;
    iVar68 = ((int)local_d28 - (int)local_d38) + local_12f8;
    iVar79 = (local_d28._4_4_ - local_d38._4_4_) + iStack_12f4;
    iVar92 = ((int)uStack_d20 - (int)uStack_d30) + iStack_12f0;
    iVar105 = (uStack_d20._4_4_ - uStack_d30._4_4_) + iStack_12ec;
    local_1418 = CONCAT44(iVar79,iVar68);
    uStack_1410 = CONCAT44(iVar105,iVar92);
    local_768 = local_1418;
    uStack_760 = uStack_1410;
    local_76c = local_108c;
    auVar73 = ZEXT416(local_108c);
    iVar68 = iVar68 >> auVar73;
    iVar79 = iVar79 >> auVar73;
    iVar92 = iVar92 >> auVar73;
    iVar105 = iVar105 >> auVar73;
    local_1418 = CONCAT44(iVar79,iVar68);
    uStack_1410 = CONCAT44(iVar105,iVar92);
    local_d98 = local_14e8;
    uStack_d90 = uStack_14e0;
    local_d88._0_4_ = (int)local_908;
    local_d88._4_4_ = (int)((ulong)local_908 >> 0x20);
    uStack_d80._0_4_ = (int)uStack_900;
    uStack_d80._4_4_ = (int)((ulong)uStack_900 >> 0x20);
    iVar69 = (int)local_d88 + iVar64;
    iVar80 = local_d88._4_4_ + iVar75;
    iVar93 = (int)uStack_d80 + iVar88;
    iVar106 = uStack_d80._4_4_ + iVar101;
    local_1408 = CONCAT44(iVar80,iVar69);
    lVar27 = local_1408;
    uStack_1400 = CONCAT44(iVar106,iVar93);
    lVar29 = uStack_1400;
    local_db8 = local_14d8;
    uStack_db0 = uStack_14d0;
    iVar70 = (int)local_798 + iVar65;
    iVar81 = local_798._4_4_ + iVar76;
    iVar94 = (int)uStack_790 + iVar89;
    iVar107 = uStack_790._4_4_ + iVar102;
    local_918 = local_14e8;
    uStack_910 = uStack_14e0;
    iVar64 = (int)local_d88 - iVar64;
    iVar75 = local_d88._4_4_ - iVar75;
    iVar88 = (int)uStack_d80 - iVar88;
    iVar101 = uStack_d80._4_4_ - iVar101;
    local_938 = local_14d8;
    uStack_930 = uStack_14d0;
    iVar65 = (int)local_798 - iVar65;
    iVar76 = local_798._4_4_ - iVar76;
    iVar89 = (int)uStack_790 - iVar89;
    iVar102 = uStack_790._4_4_ - iVar102;
    local_13d8 = CONCAT44(iVar76,iVar65);
    lVar31 = local_13d8;
    uStack_13d0 = CONCAT44(iVar102,iVar89);
    lVar33 = uStack_13d0;
    local_dd8 = local_14a8;
    uStack_dd0 = uStack_14a0;
    local_13c8 = (int)local_7d8 + iVar66;
    iStack_13c4 = local_7d8._4_4_ + iVar77;
    iStack_13c0 = (int)uStack_7d0 + iVar90;
    iStack_13bc = uStack_7d0._4_4_ + iVar103;
    local_df8 = local_1498;
    uStack_df0 = uStack_1490;
    local_de8._0_4_ = (int)local_968;
    local_de8._4_4_ = (int)((ulong)local_968 >> 0x20);
    uStack_de0._0_4_ = (int)uStack_960;
    uStack_de0._4_4_ = (int)((ulong)uStack_960 >> 0x20);
    local_13b8 = CONCAT44(local_de8._4_4_ + iStack_1394,(int)local_de8 + local_1398);
    uStack_13b0 = CONCAT44(uStack_de0._4_4_ + iStack_138c,(int)uStack_de0 + iStack_1390);
    local_958 = local_14a8;
    uStack_950 = uStack_14a0;
    local_13a8 = CONCAT44(local_7d8._4_4_ - iVar77,(int)local_7d8 - iVar66);
    uStack_13a0 = CONCAT44(uStack_7d0._4_4_ - iVar103,(int)uStack_7d0 - iVar90);
    local_978 = local_1498;
    uStack_970 = uStack_1490;
    local_1398 = (int)local_de8 - local_1398;
    iStack_1394 = local_de8._4_4_ - iStack_1394;
    iStack_1390 = (int)uStack_de0 - iStack_1390;
    iStack_138c = uStack_de0._4_4_ - iStack_138c;
    local_e18 = local_1468;
    uStack_e10 = uStack_1460;
    local_1388 = (int)local_818 + iVar67;
    iStack_1384 = local_818._4_4_ + iVar78;
    iStack_1380 = (int)uStack_810 + iVar91;
    iStack_137c = uStack_810._4_4_ + iVar104;
    local_e38 = local_1458;
    uStack_e30 = uStack_1450;
    local_e28._0_4_ = (int)local_9a8;
    local_e28._4_4_ = (int)((ulong)local_9a8 >> 0x20);
    uStack_e20._0_4_ = (int)uStack_9a0;
    uStack_e20._4_4_ = (int)((ulong)uStack_9a0 >> 0x20);
    local_1378 = CONCAT44(local_e28._4_4_ + iStack_1354,(int)local_e28 + local_1358);
    uStack_1370 = CONCAT44(uStack_e20._4_4_ + iStack_134c,(int)uStack_e20 + iStack_1350);
    local_998 = local_1468;
    uStack_990 = uStack_1460;
    local_1368 = CONCAT44(local_818._4_4_ - iVar78,(int)local_818 - iVar67);
    uStack_1360 = CONCAT44(uStack_810._4_4_ - iVar104,(int)uStack_810 - iVar91);
    local_9b8 = local_1458;
    uStack_9b0 = uStack_1450;
    local_1358 = (int)local_e28 - local_1358;
    iStack_1354 = local_e28._4_4_ - iStack_1354;
    iStack_1350 = (int)uStack_e20 - iStack_1350;
    iStack_134c = uStack_e20._4_4_ - iStack_134c;
    local_e58 = local_1428;
    uStack_e50 = uStack_1420;
    local_e48._0_4_ = (int)local_9c8;
    local_e48._4_4_ = (int)((ulong)local_9c8 >> 0x20);
    uStack_e40._0_4_ = (int)uStack_9c0;
    uStack_e40._4_4_ = (int)((ulong)uStack_9c0 >> 0x20);
    _local_1348 = CONCAT44(local_e48._4_4_ + iStack_1324,(int)local_e48 + local_1328);
    _iStack_1340 = CONCAT44(uStack_e40._4_4_ + iStack_131c,(int)uStack_e40 + iStack_1320);
    local_e78 = local_1418;
    uStack_e70 = uStack_1410;
    local_1338 = (int)local_858 + iVar68;
    iStack_1334 = local_858._4_4_ + iVar79;
    iStack_1330 = (int)uStack_850 + iVar92;
    iStack_132c = uStack_850._4_4_ + iVar105;
    local_9d8 = local_1428;
    uStack_9d0 = uStack_1420;
    local_1328 = (int)local_e48 - local_1328;
    iStack_1324 = local_e48._4_4_ - iStack_1324;
    iStack_1320 = (int)uStack_e40 - iStack_1320;
    iStack_131c = uStack_e40._4_4_ - iStack_131c;
    local_9f8 = local_1418;
    uStack_9f0 = uStack_1410;
    _local_1318 = CONCAT44(local_858._4_4_ - iVar79,(int)local_858 - iVar68);
    _iStack_1310 = CONCAT44(uStack_850._4_4_ - iVar105,(int)uStack_850 - iVar92);
    local_13f8 = iVar70;
    iStack_13f4 = iVar81;
    iStack_13f0 = iVar94;
    iStack_13ec = iVar107;
    local_13e8 = iVar64;
    iStack_13e4 = iVar75;
    iStack_13e0 = iVar88;
    iStack_13dc = iVar101;
    local_e48 = local_9c8;
    uStack_e40 = uStack_9c0;
    local_e28 = local_9a8;
    uStack_e20 = uStack_9a0;
    local_de8 = local_968;
    uStack_de0 = uStack_960;
    local_d88 = local_908;
    uStack_d80 = uStack_900;
    local_d38 = uVar41;
    uStack_d30 = uVar42;
    local_d28 = uVar43;
    uStack_d20 = uVar44;
    local_cd8 = uVar45;
    uStack_cd0 = uVar46;
    local_cc8 = uVar47;
    uStack_cc0 = uVar48;
    local_c78 = uVar49;
    uStack_c70 = uVar50;
    local_c68 = uVar51;
    uStack_c60 = uVar52;
    local_c18 = uVar53;
    uStack_c10 = uVar54;
    local_c08 = uVar55;
    uStack_c00 = uVar56;
    local_9e8 = local_e68;
    uStack_9e0 = uStack_e60;
    local_988 = local_e08;
    uStack_980 = uStack_e00;
    local_948 = local_dc8;
    uStack_940 = uStack_dc0;
    local_928 = local_da8;
    uStack_920 = uStack_da0;
    local_878 = uVar15;
    uStack_870 = uVar16;
    local_858 = uVar13;
    uStack_850 = uVar14;
    local_838 = uVar11;
    uStack_830 = uVar12;
    local_818 = uVar9;
    uStack_810 = uVar10;
    local_7f8 = uVar7;
    uStack_7f0 = uVar8;
    local_7d8 = uVar5;
    uStack_7d0 = uVar6;
    local_7b8 = uVar3;
    uStack_7b0 = uVar4;
    local_798 = uVar1;
    uStack_790 = uVar2;
    local_788 = uVar57;
    uStack_780 = uVar58;
    half_btf_sse4_1((__m128i *)&local_10c8,(__m128i *)&local_13c8,(__m128i *)&local_10b8,
                    (__m128i *)&local_13b8,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_10b8,(__m128i *)&local_13c8,(__m128i *)&local_10d8,
                    (__m128i *)&local_13b8,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_10e8,(__m128i *)&local_13a8,(__m128i *)&local_10c8,
                    (__m128i *)&local_1398,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_10c8,(__m128i *)&local_13a8,(__m128i *)&local_10b8,
                    (__m128i *)&local_1398,(__m128i *)&local_12f8,local_108c);
    iVar91 = iStack_134c;
    iVar90 = iStack_1350;
    iVar79 = iStack_1354;
    iVar78 = local_1358;
    lVar40 = uStack_1360;
    lVar39 = local_1368;
    lVar38 = uStack_1370;
    lVar37 = local_1378;
    iVar77 = iStack_137c;
    iVar68 = iStack_1380;
    iVar67 = iStack_1384;
    iVar66 = local_1388;
    uVar1 = CONCAT44(iStack_1384,local_1388);
    uVar2 = CONCAT44(iStack_137c,iStack_1380);
    uVar3 = CONCAT44(iStack_1354,local_1358);
    uVar4 = CONCAT44(iStack_134c,iStack_1350);
    half_btf_sse4_1((__m128i *)&local_10c8,(__m128i *)&local_1348,(__m128i *)&local_10b8,
                    (__m128i *)&local_1338,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_10b8,(__m128i *)&local_1348,(__m128i *)&local_10d8,
                    (__m128i *)&local_1338,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_10e8,(__m128i *)&local_1328,(__m128i *)&local_10c8,
                    (__m128i *)&local_1318,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_10c8,(__m128i *)&local_1328,(__m128i *)&local_10b8,
                    (__m128i *)&local_1318,(__m128i *)&local_12f8,local_108c);
    local_e88 = lVar27;
    lStack_e80 = lVar29;
    local_e98 = (int)extraout_XMM0_Qa;
    iStack_e94 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
    iStack_e90 = (int)extraout_XMM0_Qb;
    iStack_e8c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    iVar92 = iVar69 + local_e98;
    iVar82 = iVar80 + iStack_e94;
    iVar95 = iVar93 + iStack_e90;
    iVar108 = iVar106 + iStack_e8c;
    local_1408 = CONCAT44(iVar82,iVar92);
    lVar28 = local_1408;
    uStack_1400 = CONCAT44(iVar108,iVar95);
    lVar30 = uStack_1400;
    local_eb8 = (int)extraout_XMM0_Qa_00;
    iStack_eb4 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    iStack_eb0 = (int)extraout_XMM0_Qb_00;
    iStack_eac = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    iVar103 = iVar70 + local_eb8;
    iVar83 = iVar81 + iStack_eb4;
    iVar96 = iVar94 + iStack_eb0;
    iVar109 = iVar107 + iStack_eac;
    local_ed8 = (int)extraout_XMM0_Qa_01;
    iStack_ed4 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    iStack_ed0 = (int)extraout_XMM0_Qb_01;
    iStack_ecc = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    iVar104 = iVar64 + local_ed8;
    iVar84 = iVar75 + iStack_ed4;
    iVar97 = iVar88 + iStack_ed0;
    iVar110 = iVar101 + iStack_ecc;
    local_ee8 = lVar31;
    lStack_ee0 = lVar33;
    local_ef8 = (int)extraout_XMM0_Qa_02;
    iStack_ef4 = (int)((ulong)extraout_XMM0_Qa_02 >> 0x20);
    iStack_ef0 = (int)extraout_XMM0_Qb_02;
    iStack_eec = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
    iVar105 = iVar65 + local_ef8;
    iVar85 = iVar76 + iStack_ef4;
    iVar98 = iVar89 + iStack_ef0;
    iVar111 = iVar102 + iStack_eec;
    local_13d8 = CONCAT44(iVar85,iVar105);
    lVar32 = local_13d8;
    uStack_13d0 = CONCAT44(iVar111,iVar98);
    lVar34 = uStack_13d0;
    local_a08 = lVar27;
    lStack_a00 = lVar29;
    iVar69 = iVar69 - local_e98;
    iVar80 = iVar80 - iStack_e94;
    iVar93 = iVar93 - iStack_e90;
    iVar106 = iVar106 - iStack_e8c;
    iVar71 = iVar70 - local_eb8;
    iVar86 = iVar81 - iStack_eb4;
    iVar99 = iVar94 - iStack_eb0;
    iVar112 = iVar107 - iStack_eac;
    local_13b8 = CONCAT44(iVar86,iVar71);
    lVar27 = local_13b8;
    uStack_13b0 = CONCAT44(iVar112,iVar99);
    lVar29 = uStack_13b0;
    iVar72 = iVar64 - local_ed8;
    iVar87 = iVar75 - iStack_ed4;
    iVar100 = iVar88 - iStack_ed0;
    iVar113 = iVar101 - iStack_ecc;
    local_13a8 = CONCAT44(iVar87,iVar72);
    lVar35 = local_13a8;
    uStack_13a0 = CONCAT44(iVar113,iVar100);
    lVar36 = uStack_13a0;
    local_a68 = lVar31;
    lStack_a60 = lVar33;
    iVar65 = iVar65 - local_ef8;
    iVar76 = iVar76 - iStack_ef4;
    iVar89 = iVar89 - iStack_ef0;
    iVar102 = iVar102 - iStack_eec;
    local_f18 = (int)extraout_XMM0_Qa_03;
    iStack_f14 = (int)((ulong)extraout_XMM0_Qa_03 >> 0x20);
    iStack_f10 = (int)extraout_XMM0_Qb_03;
    iStack_f0c = (int)((ulong)extraout_XMM0_Qb_03 >> 0x20);
    local_1388 = iVar66 + local_f18;
    iStack_1384 = iVar67 + iStack_f14;
    iStack_1380 = iVar68 + iStack_f10;
    iStack_137c = iVar77 + iStack_f0c;
    local_f28 = lVar37;
    uStack_f20 = lVar38;
    local_f28._0_4_ = (int)lVar37;
    local_f28._4_4_ = (int)((ulong)lVar37 >> 0x20);
    uStack_f20._0_4_ = (int)lVar38;
    uStack_f20._4_4_ = (int)((ulong)lVar38 >> 0x20);
    local_f38 = (int)extraout_XMM0_Qa_04;
    iStack_f34 = (int)((ulong)extraout_XMM0_Qa_04 >> 0x20);
    iStack_f30 = (int)extraout_XMM0_Qb_04;
    iStack_f2c = (int)((ulong)extraout_XMM0_Qb_04 >> 0x20);
    local_1378 = CONCAT44(local_f28._4_4_ + iStack_f34,(int)local_f28 + local_f38);
    uStack_1370 = CONCAT44(uStack_f20._4_4_ + iStack_f2c,(int)uStack_f20 + iStack_f30);
    local_f48 = lVar39;
    lVar31 = local_f48;
    uStack_f40 = lVar40;
    lVar33 = uStack_f40;
    local_f48._0_4_ = (int)lVar39;
    local_f48._4_4_ = (int)((ulong)lVar39 >> 0x20);
    uStack_f40._0_4_ = (int)lVar40;
    uStack_f40._4_4_ = (int)((ulong)lVar40 >> 0x20);
    local_f58 = (int)extraout_XMM0_Qa_05;
    iStack_f54 = (int)((ulong)extraout_XMM0_Qa_05 >> 0x20);
    iStack_f50 = (int)extraout_XMM0_Qb_05;
    iStack_f4c = (int)((ulong)extraout_XMM0_Qb_05 >> 0x20);
    local_1368 = CONCAT44(local_f48._4_4_ + iStack_f54,(int)local_f48 + local_f58);
    uStack_1360 = CONCAT44(uStack_f40._4_4_ + iStack_f4c,(int)uStack_f40 + iStack_f50);
    local_f78 = (int)extraout_XMM0_Qa_06;
    iStack_f74 = (int)((ulong)extraout_XMM0_Qa_06 >> 0x20);
    iStack_f70 = (int)extraout_XMM0_Qb_06;
    iStack_f6c = (int)((ulong)extraout_XMM0_Qb_06 >> 0x20);
    local_1358 = iVar78 + local_f78;
    iStack_1354 = iVar79 + iStack_f74;
    iStack_1350 = iVar90 + iStack_f70;
    iStack_134c = iVar91 + iStack_f6c;
    _local_1348 = CONCAT44(iVar67 - iStack_f14,iVar66 - local_f18);
    _iStack_1340 = CONCAT44(iVar77 - iStack_f0c,iVar68 - iStack_f10);
    local_aa8 = lVar37;
    lStack_aa0 = lVar38;
    local_1338 = (int)local_f28 - local_f38;
    iStack_1334 = local_f28._4_4_ - iStack_f34;
    iStack_1330 = (int)uStack_f20 - iStack_f30;
    iStack_132c = uStack_f20._4_4_ - iStack_f2c;
    local_ac8 = lVar39;
    lStack_ac0 = lVar40;
    local_1328 = (int)local_f48 - local_f58;
    iStack_1324 = local_f48._4_4_ - iStack_f54;
    iStack_1320 = (int)uStack_f40 - iStack_f50;
    iStack_131c = uStack_f40._4_4_ - iStack_f4c;
    _local_1318 = CONCAT44(iVar79 - iStack_f74,iVar78 - local_f78);
    _iStack_1310 = CONCAT44(iVar91 - iStack_f6c,iVar90 - iStack_f70);
    local_13f8 = iVar103;
    iStack_13f4 = iVar83;
    iStack_13f0 = iVar96;
    iStack_13ec = iVar109;
    local_13e8 = iVar104;
    iStack_13e4 = iVar84;
    iStack_13e0 = iVar97;
    iStack_13dc = iVar110;
    local_13c8 = iVar69;
    iStack_13c4 = iVar80;
    iStack_13c0 = iVar93;
    iStack_13bc = iVar106;
    local_1398 = iVar65;
    iStack_1394 = iVar76;
    iStack_1390 = iVar89;
    iStack_138c = iVar102;
    local_f68 = uVar3;
    uStack_f60 = uVar4;
    local_f48 = lVar31;
    uStack_f40 = lVar33;
    local_f28 = lVar37;
    uStack_f20 = lVar38;
    local_f08 = uVar1;
    uStack_f00 = uVar2;
    local_ec8 = CONCAT44(iVar75,iVar64);
    uStack_ec0 = CONCAT44(iVar101,iVar88);
    local_ea8 = CONCAT44(iVar81,iVar70);
    uStack_ea0 = CONCAT44(iVar107,iVar94);
    local_ae8 = uVar3;
    uStack_ae0 = uVar4;
    local_a88 = uVar1;
    uStack_a80 = uVar2;
    local_a48 = CONCAT44(iVar75,iVar64);
    uStack_a40 = CONCAT44(iVar101,iVar88);
    local_a28 = CONCAT44(iVar81,iVar70);
    uStack_a20 = CONCAT44(iVar107,iVar94);
    half_btf_sse4_1((__m128i *)&local_10f8,(__m128i *)&local_1388,(__m128i *)&local_1108,
                    (__m128i *)&local_1378,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1108,(__m128i *)&local_1388,(__m128i *)&local_1128,
                    (__m128i *)&local_1378,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1168,(__m128i *)&local_1368,(__m128i *)&local_1138,
                    (__m128i *)&local_1358,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1138,(__m128i *)&local_1368,(__m128i *)&local_1158,
                    (__m128i *)&local_1358,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1118,(__m128i *)&local_1348,(__m128i *)&local_10f8,
                    (__m128i *)&local_1338,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_10f8,(__m128i *)&local_1348,(__m128i *)&local_1108,
                    (__m128i *)&local_1338,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1148,(__m128i *)&local_1328,(__m128i *)&local_1168,
                    (__m128i *)&local_1318,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1168,(__m128i *)&local_1328,(__m128i *)&local_1138,
                    (__m128i *)&local_1318,(__m128i *)&local_12f8,local_108c);
    local_f88 = lVar28;
    lStack_f80 = lVar30;
    local_f98 = (int)extraout_XMM0_Qa_07;
    iStack_f94 = (int)((ulong)extraout_XMM0_Qa_07 >> 0x20);
    iStack_f90 = (int)extraout_XMM0_Qb_07;
    iStack_f8c = (int)((ulong)extraout_XMM0_Qb_07 >> 0x20);
    local_1408 = CONCAT44(iVar82 + iStack_f94,iVar92 + local_f98);
    uStack_1400 = CONCAT44(iVar108 + iStack_f8c,iVar95 + iStack_f90);
    local_fb8 = (int)extraout_XMM0_Qa_08;
    iStack_fb4 = (int)((ulong)extraout_XMM0_Qa_08 >> 0x20);
    iStack_fb0 = (int)extraout_XMM0_Qb_08;
    iStack_fac = (int)((ulong)extraout_XMM0_Qb_08 >> 0x20);
    local_13f8 = iVar103 + local_fb8;
    iStack_13f4 = iVar83 + iStack_fb4;
    iStack_13f0 = iVar96 + iStack_fb0;
    iStack_13ec = iVar109 + iStack_fac;
    local_fd8 = (int)extraout_XMM0_Qa_09;
    iStack_fd4 = (int)((ulong)extraout_XMM0_Qa_09 >> 0x20);
    iStack_fd0 = (int)extraout_XMM0_Qb_09;
    iStack_fcc = (int)((ulong)extraout_XMM0_Qb_09 >> 0x20);
    local_13e8 = iVar104 + local_fd8;
    iStack_13e4 = iVar84 + iStack_fd4;
    iStack_13e0 = iVar97 + iStack_fd0;
    iStack_13dc = iVar110 + iStack_fcc;
    local_fe8 = lVar32;
    lStack_fe0 = lVar34;
    local_ff8 = (int)extraout_XMM0_Qa_10;
    iStack_ff4 = (int)((ulong)extraout_XMM0_Qa_10 >> 0x20);
    iStack_ff0 = (int)extraout_XMM0_Qb_10;
    iStack_fec = (int)((ulong)extraout_XMM0_Qb_10 >> 0x20);
    local_13d8 = CONCAT44(iVar85 + iStack_ff4,iVar105 + local_ff8);
    uStack_13d0 = CONCAT44(iVar111 + iStack_fec,iVar98 + iStack_ff0);
    local_1018 = (int)extraout_XMM0_Qa_11;
    iStack_1014 = (int)((ulong)extraout_XMM0_Qa_11 >> 0x20);
    iStack_1010 = (int)extraout_XMM0_Qb_11;
    iStack_100c = (int)((ulong)extraout_XMM0_Qb_11 >> 0x20);
    local_13c8 = iVar69 + local_1018;
    iStack_13c4 = iVar80 + iStack_1014;
    iStack_13c0 = iVar93 + iStack_1010;
    iStack_13bc = iVar106 + iStack_100c;
    local_1028 = lVar27;
    lStack_1020 = lVar29;
    local_1038 = (int)extraout_XMM0_Qa_12;
    iStack_1034 = (int)((ulong)extraout_XMM0_Qa_12 >> 0x20);
    iStack_1030 = (int)extraout_XMM0_Qb_12;
    iStack_102c = (int)((ulong)extraout_XMM0_Qb_12 >> 0x20);
    local_13b8 = CONCAT44(iVar86 + iStack_1034,iVar71 + local_1038);
    uStack_13b0 = CONCAT44(iVar112 + iStack_102c,iVar99 + iStack_1030);
    local_1048 = lVar35;
    lStack_1040 = lVar36;
    local_1058 = (int)extraout_XMM0_Qa_13;
    iStack_1054 = (int)((ulong)extraout_XMM0_Qa_13 >> 0x20);
    iStack_1050 = (int)extraout_XMM0_Qb_13;
    iStack_104c = (int)((ulong)extraout_XMM0_Qb_13 >> 0x20);
    local_13a8 = CONCAT44(iVar87 + iStack_1054,iVar72 + local_1058);
    uStack_13a0 = CONCAT44(iVar113 + iStack_104c,iVar100 + iStack_1050);
    local_1078 = (int)extraout_XMM0_Qa_14;
    iStack_1074 = (int)((ulong)extraout_XMM0_Qa_14 >> 0x20);
    iStack_1070 = (int)extraout_XMM0_Qb_14;
    iStack_106c = (int)((ulong)extraout_XMM0_Qb_14 >> 0x20);
    local_1398 = iVar65 + local_1078;
    iStack_1394 = iVar76 + iStack_1074;
    iStack_1390 = iVar89 + iStack_1070;
    iStack_138c = iVar102 + iStack_106c;
    local_b08 = lVar28;
    lStack_b00 = lVar30;
    local_1388 = iVar92 - local_f98;
    iStack_1384 = iVar82 - iStack_f94;
    iStack_1380 = iVar95 - iStack_f90;
    iStack_137c = iVar108 - iStack_f8c;
    local_1378 = CONCAT44(iVar83 - iStack_fb4,iVar103 - local_fb8);
    uStack_1370 = CONCAT44(iVar109 - iStack_fac,iVar96 - iStack_fb0);
    local_1368 = CONCAT44(iVar84 - iStack_fd4,iVar104 - local_fd8);
    uStack_1360 = CONCAT44(iVar110 - iStack_fcc,iVar97 - iStack_fd0);
    local_b68 = lVar32;
    lStack_b60 = lVar34;
    local_1358 = iVar105 - local_ff8;
    iStack_1354 = iVar85 - iStack_ff4;
    iStack_1350 = iVar98 - iStack_ff0;
    iStack_134c = iVar111 - iStack_fec;
    _local_1348 = CONCAT44(iVar80 - iStack_1014,iVar69 - local_1018);
    _iStack_1340 = CONCAT44(iVar106 - iStack_100c,iVar93 - iStack_1010);
    local_ba8 = lVar27;
    lStack_ba0 = lVar29;
    local_1338 = iVar71 - local_1038;
    iStack_1334 = iVar86 - iStack_1034;
    iStack_1330 = iVar99 - iStack_1030;
    iStack_132c = iVar112 - iStack_102c;
    local_bc8 = lVar35;
    lStack_bc0 = lVar36;
    local_1328 = iVar72 - local_1058;
    iStack_1324 = iVar87 - iStack_1054;
    iStack_1320 = iVar100 - iStack_1050;
    iStack_131c = iVar113 - iStack_104c;
    _local_1318 = CONCAT44(iVar76 - iStack_1074,iVar65 - local_1078);
    _iStack_1310 = CONCAT44(iVar102 - iStack_106c,iVar89 - iStack_1070);
    local_1068 = CONCAT44(iVar76,iVar65);
    uStack_1060 = CONCAT44(iVar102,iVar89);
    local_1008 = CONCAT44(iVar80,iVar69);
    uStack_1000 = CONCAT44(iVar106,iVar93);
    local_fc8 = CONCAT44(iVar84,iVar104);
    uStack_fc0 = CONCAT44(iVar110,iVar97);
    local_fa8 = CONCAT44(iVar83,iVar103);
    uStack_fa0 = CONCAT44(iVar109,iVar96);
    local_be8 = CONCAT44(iVar76,iVar65);
    uStack_be0 = CONCAT44(iVar102,iVar89);
    local_b88 = CONCAT44(iVar80,iVar69);
    uStack_b80 = CONCAT44(iVar106,iVar93);
    local_b48 = CONCAT44(iVar84,iVar104);
    uStack_b40 = CONCAT44(iVar110,iVar97);
    local_b28 = CONCAT44(iVar83,iVar103);
    uStack_b20 = CONCAT44(iVar109,iVar96);
    half_btf_sse4_1((__m128i *)&local_1178,(__m128i *)&local_1408,(__m128i *)&local_1188,
                    (__m128i *)&local_13f8,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1188,(__m128i *)&local_1408,(__m128i *)&local_1198,
                    (__m128i *)&local_13f8,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_11a8,(__m128i *)&local_13e8,(__m128i *)&local_11b8,
                    (__m128i *)&local_13d8,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_11b8,(__m128i *)&local_13e8,(__m128i *)&local_11c8,
                    (__m128i *)&local_13d8,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_11d8,(__m128i *)&local_13c8,(__m128i *)&local_11e8,
                    (__m128i *)&local_13b8,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_11e8,(__m128i *)&local_13c8,(__m128i *)&local_11f8,
                    (__m128i *)&local_13b8,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1208,(__m128i *)&local_13a8,(__m128i *)&local_1218,
                    (__m128i *)&local_1398,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1218,(__m128i *)&local_13a8,(__m128i *)&local_1228,
                    (__m128i *)&local_1398,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1238,(__m128i *)&local_1388,(__m128i *)&local_1248,
                    (__m128i *)&local_1378,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1248,(__m128i *)&local_1388,(__m128i *)&local_1258,
                    (__m128i *)&local_1378,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1268,(__m128i *)&local_1368,(__m128i *)&local_1278,
                    (__m128i *)&local_1358,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1278,(__m128i *)&local_1368,(__m128i *)&local_1288,
                    (__m128i *)&local_1358,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_1298,(__m128i *)&local_1348,(__m128i *)&local_12a8,
                    (__m128i *)&local_1338,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_12a8,(__m128i *)&local_1348,(__m128i *)&local_12b8,
                    (__m128i *)&local_1338,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_12c8,(__m128i *)&local_1328,(__m128i *)&local_12d8,
                    (__m128i *)&local_1318,(__m128i *)&local_12f8,local_108c);
    half_btf_sse4_1((__m128i *)&local_12d8,(__m128i *)&local_1328,(__m128i *)&local_12e8,
                    (__m128i *)&local_1318,(__m128i *)&local_12f8,local_108c);
    puVar59 = (undefined8 *)(local_1088 + (long)local_152c * 0x10);
    *puVar59 = extraout_XMM0_Qa_16;
    puVar59[1] = extraout_XMM0_Qb_16;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_29;
    puVar59[1] = extraout_XMM0_Qb_29;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 2 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_18;
    puVar59[1] = extraout_XMM0_Qb_18;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 3 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_27;
    puVar59[1] = extraout_XMM0_Qb_27;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 4 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_20;
    puVar59[1] = extraout_XMM0_Qb_20;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 5 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_25;
    puVar59[1] = extraout_XMM0_Qb_25;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 6 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_22;
    puVar59[1] = extraout_XMM0_Qb_22;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 7 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_23;
    puVar59[1] = extraout_XMM0_Qb_23;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 8 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_24;
    puVar59[1] = extraout_XMM0_Qb_24;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 9 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_21;
    puVar59[1] = extraout_XMM0_Qb_21;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 10 + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_26;
    puVar59[1] = extraout_XMM0_Qb_26;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 0xb + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_19;
    puVar59[1] = extraout_XMM0_Qb_19;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 0xc + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_28;
    puVar59[1] = extraout_XMM0_Qb_28;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 0xd + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_17;
    puVar59[1] = extraout_XMM0_Qb_17;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 0xe + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_30;
    puVar59[1] = extraout_XMM0_Qb_30;
    puVar59 = (undefined8 *)(local_1088 + (long)(local_1090 * 0xf + local_152c) * 0x10);
    *puVar59 = extraout_XMM0_Qa_15;
    puVar59[1] = extraout_XMM0_Qb_15;
  }
  return;
}

Assistant:

static void fadst16x16_sse4_1(__m128i *in, __m128i *out, int bit,
                              const int num_cols) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospim2 = _mm_set1_epi32(-cospi[2]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospim10 = _mm_set1_epi32(-cospi[10]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospim18 = _mm_set1_epi32(-cospi[18]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospim26 = _mm_set1_epi32(-cospi[26]);
  const __m128i cospi34 = _mm_set1_epi32(cospi[34]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospim34 = _mm_set1_epi32(-cospi[34]);
  const __m128i cospi42 = _mm_set1_epi32(cospi[42]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospim42 = _mm_set1_epi32(-cospi[42]);
  const __m128i cospi50 = _mm_set1_epi32(cospi[50]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospi58 = _mm_set1_epi32(cospi[58]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();

  __m128i u[16], v[16], x, y;
  int col;

  for (col = 0; col < num_cols; ++col) {
    // stage 0
    // stage 1
    u[0] = in[0 * num_cols + col];
    u[1] = _mm_sub_epi32(zero, in[15 * num_cols + col]);
    u[2] = _mm_sub_epi32(zero, in[7 * num_cols + col]);
    u[3] = in[8 * num_cols + col];
    u[4] = _mm_sub_epi32(zero, in[3 * num_cols + col]);
    u[5] = in[12 * num_cols + col];
    u[6] = in[4 * num_cols + col];
    u[7] = _mm_sub_epi32(zero, in[11 * num_cols + col]);
    u[8] = _mm_sub_epi32(zero, in[1 * num_cols + col]);
    u[9] = in[14 * num_cols + col];
    u[10] = in[6 * num_cols + col];
    u[11] = _mm_sub_epi32(zero, in[9 * num_cols + col]);
    u[12] = in[2 * num_cols + col];
    u[13] = _mm_sub_epi32(zero, in[13 * num_cols + col]);
    u[14] = _mm_sub_epi32(zero, in[5 * num_cols + col]);
    u[15] = in[10 * num_cols + col];

    // stage 2
    v[0] = u[0];
    v[1] = u[1];

    x = _mm_mullo_epi32(u[2], cospi32);
    y = _mm_mullo_epi32(u[3], cospi32);
    v[2] = _mm_add_epi32(x, y);
    v[2] = _mm_add_epi32(v[2], rnding);
    v[2] = _mm_srai_epi32(v[2], bit);

    v[3] = _mm_sub_epi32(x, y);
    v[3] = _mm_add_epi32(v[3], rnding);
    v[3] = _mm_srai_epi32(v[3], bit);

    v[4] = u[4];
    v[5] = u[5];

    x = _mm_mullo_epi32(u[6], cospi32);
    y = _mm_mullo_epi32(u[7], cospi32);
    v[6] = _mm_add_epi32(x, y);
    v[6] = _mm_add_epi32(v[6], rnding);
    v[6] = _mm_srai_epi32(v[6], bit);

    v[7] = _mm_sub_epi32(x, y);
    v[7] = _mm_add_epi32(v[7], rnding);
    v[7] = _mm_srai_epi32(v[7], bit);

    v[8] = u[8];
    v[9] = u[9];

    x = _mm_mullo_epi32(u[10], cospi32);
    y = _mm_mullo_epi32(u[11], cospi32);
    v[10] = _mm_add_epi32(x, y);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[11] = _mm_sub_epi32(x, y);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = u[12];
    v[13] = u[13];

    x = _mm_mullo_epi32(u[14], cospi32);
    y = _mm_mullo_epi32(u[15], cospi32);
    v[14] = _mm_add_epi32(x, y);
    v[14] = _mm_add_epi32(v[14], rnding);
    v[14] = _mm_srai_epi32(v[14], bit);

    v[15] = _mm_sub_epi32(x, y);
    v[15] = _mm_add_epi32(v[15], rnding);
    v[15] = _mm_srai_epi32(v[15], bit);

    // stage 3
    u[0] = _mm_add_epi32(v[0], v[2]);
    u[1] = _mm_add_epi32(v[1], v[3]);
    u[2] = _mm_sub_epi32(v[0], v[2]);
    u[3] = _mm_sub_epi32(v[1], v[3]);
    u[4] = _mm_add_epi32(v[4], v[6]);
    u[5] = _mm_add_epi32(v[5], v[7]);
    u[6] = _mm_sub_epi32(v[4], v[6]);
    u[7] = _mm_sub_epi32(v[5], v[7]);
    u[8] = _mm_add_epi32(v[8], v[10]);
    u[9] = _mm_add_epi32(v[9], v[11]);
    u[10] = _mm_sub_epi32(v[8], v[10]);
    u[11] = _mm_sub_epi32(v[9], v[11]);
    u[12] = _mm_add_epi32(v[12], v[14]);
    u[13] = _mm_add_epi32(v[13], v[15]);
    u[14] = _mm_sub_epi32(v[12], v[14]);
    u[15] = _mm_sub_epi32(v[13], v[15]);

    // stage 4
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = half_btf_sse4_1(&cospi16, &u[4], &cospi48, &u[5], &rnding, bit);
    v[5] = half_btf_sse4_1(&cospi48, &u[4], &cospim16, &u[5], &rnding, bit);
    v[6] = half_btf_sse4_1(&cospim48, &u[6], &cospi16, &u[7], &rnding, bit);
    v[7] = half_btf_sse4_1(&cospi16, &u[6], &cospi48, &u[7], &rnding, bit);
    v[8] = u[8];
    v[9] = u[9];
    v[10] = u[10];
    v[11] = u[11];
    v[12] = half_btf_sse4_1(&cospi16, &u[12], &cospi48, &u[13], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi48, &u[12], &cospim16, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospim48, &u[14], &cospi16, &u[15], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi16, &u[14], &cospi48, &u[15], &rnding, bit);

    // stage 5
    u[0] = _mm_add_epi32(v[0], v[4]);
    u[1] = _mm_add_epi32(v[1], v[5]);
    u[2] = _mm_add_epi32(v[2], v[6]);
    u[3] = _mm_add_epi32(v[3], v[7]);
    u[4] = _mm_sub_epi32(v[0], v[4]);
    u[5] = _mm_sub_epi32(v[1], v[5]);
    u[6] = _mm_sub_epi32(v[2], v[6]);
    u[7] = _mm_sub_epi32(v[3], v[7]);
    u[8] = _mm_add_epi32(v[8], v[12]);
    u[9] = _mm_add_epi32(v[9], v[13]);
    u[10] = _mm_add_epi32(v[10], v[14]);
    u[11] = _mm_add_epi32(v[11], v[15]);
    u[12] = _mm_sub_epi32(v[8], v[12]);
    u[13] = _mm_sub_epi32(v[9], v[13]);
    u[14] = _mm_sub_epi32(v[10], v[14]);
    u[15] = _mm_sub_epi32(v[11], v[15]);

    // stage 6
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];
    v[8] = half_btf_sse4_1(&cospi8, &u[8], &cospi56, &u[9], &rnding, bit);
    v[9] = half_btf_sse4_1(&cospi56, &u[8], &cospim8, &u[9], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospi40, &u[10], &cospi24, &u[11], &rnding, bit);
    v[11] = half_btf_sse4_1(&cospi24, &u[10], &cospim40, &u[11], &rnding, bit);
    v[12] = half_btf_sse4_1(&cospim56, &u[12], &cospi8, &u[13], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi8, &u[12], &cospi56, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospim24, &u[14], &cospi40, &u[15], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi40, &u[14], &cospi24, &u[15], &rnding, bit);

    // stage 7
    u[0] = _mm_add_epi32(v[0], v[8]);
    u[1] = _mm_add_epi32(v[1], v[9]);
    u[2] = _mm_add_epi32(v[2], v[10]);
    u[3] = _mm_add_epi32(v[3], v[11]);
    u[4] = _mm_add_epi32(v[4], v[12]);
    u[5] = _mm_add_epi32(v[5], v[13]);
    u[6] = _mm_add_epi32(v[6], v[14]);
    u[7] = _mm_add_epi32(v[7], v[15]);
    u[8] = _mm_sub_epi32(v[0], v[8]);
    u[9] = _mm_sub_epi32(v[1], v[9]);
    u[10] = _mm_sub_epi32(v[2], v[10]);
    u[11] = _mm_sub_epi32(v[3], v[11]);
    u[12] = _mm_sub_epi32(v[4], v[12]);
    u[13] = _mm_sub_epi32(v[5], v[13]);
    u[14] = _mm_sub_epi32(v[6], v[14]);
    u[15] = _mm_sub_epi32(v[7], v[15]);

    // stage 8
    v[0] = half_btf_sse4_1(&cospi2, &u[0], &cospi62, &u[1], &rnding, bit);
    v[1] = half_btf_sse4_1(&cospi62, &u[0], &cospim2, &u[1], &rnding, bit);
    v[2] = half_btf_sse4_1(&cospi10, &u[2], &cospi54, &u[3], &rnding, bit);
    v[3] = half_btf_sse4_1(&cospi54, &u[2], &cospim10, &u[3], &rnding, bit);
    v[4] = half_btf_sse4_1(&cospi18, &u[4], &cospi46, &u[5], &rnding, bit);
    v[5] = half_btf_sse4_1(&cospi46, &u[4], &cospim18, &u[5], &rnding, bit);
    v[6] = half_btf_sse4_1(&cospi26, &u[6], &cospi38, &u[7], &rnding, bit);
    v[7] = half_btf_sse4_1(&cospi38, &u[6], &cospim26, &u[7], &rnding, bit);
    v[8] = half_btf_sse4_1(&cospi34, &u[8], &cospi30, &u[9], &rnding, bit);
    v[9] = half_btf_sse4_1(&cospi30, &u[8], &cospim34, &u[9], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospi42, &u[10], &cospi22, &u[11], &rnding, bit);
    v[11] = half_btf_sse4_1(&cospi22, &u[10], &cospim42, &u[11], &rnding, bit);
    v[12] = half_btf_sse4_1(&cospi50, &u[12], &cospi14, &u[13], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi14, &u[12], &cospim50, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospi58, &u[14], &cospi6, &u[15], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi6, &u[14], &cospim58, &u[15], &rnding, bit);

    // stage 9
    out[0 * num_cols + col] = v[1];
    out[1 * num_cols + col] = v[14];
    out[2 * num_cols + col] = v[3];
    out[3 * num_cols + col] = v[12];
    out[4 * num_cols + col] = v[5];
    out[5 * num_cols + col] = v[10];
    out[6 * num_cols + col] = v[7];
    out[7 * num_cols + col] = v[8];
    out[8 * num_cols + col] = v[9];
    out[9 * num_cols + col] = v[6];
    out[10 * num_cols + col] = v[11];
    out[11 * num_cols + col] = v[4];
    out[12 * num_cols + col] = v[13];
    out[13 * num_cols + col] = v[2];
    out[14 * num_cols + col] = v[15];
    out[15 * num_cols + col] = v[0];
  }
}